

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int ptls_handshake(ptls_t *tls,ptls_buffer_t *sendbuf,void *input,size_t *inlen,
                  ptls_handshake_properties_t *properties)

{
  undefined1 *puVar1;
  void *pvVar2;
  uint8_t *puVar3;
  byte bVar4;
  uint16_t uVar5;
  ushort uVar6;
  size_t sVar7;
  ptls_context_t *ppVar8;
  ptls_hash_algorithm_t *algo;
  uint8_t *puVar9;
  st_ptls_hash_context_t *psVar10;
  ptls_key_exchange_algorithm_t *ppVar11;
  ptls_key_exchange_algorithm_t **pppVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  st_ptls_key_schedule_t *sched;
  int iVar16;
  ptls_t *ppVar17;
  long lVar18;
  ulong uVar19;
  anon_enum_32 aVar20;
  ushort *puVar21;
  size_t sVar22;
  long lVar23;
  long lVar24;
  size_t sVar25;
  size_t sVar26;
  ptls_cipher_suite_t **pppVar27;
  ulong uVar28;
  size_t sVar29;
  uint16_t in_R11W;
  ushort *end;
  ulong uVar30;
  ushort *puVar31;
  bool bVar32;
  bool bVar33;
  ptls_iovec_t ikm;
  size_t consumed;
  uint32_t _v;
  uint32_t max_early_data_size;
  uint32_t age_add;
  ptls_buffer_t decryptbuf;
  uint32_t lifetime;
  uint8_t decryptbuf_small [256];
  size_t local_1c8;
  size_t local_1b8;
  ptls_cipher_suite_t *local_1b0;
  ptls_key_exchange_algorithm_t **local_1a8;
  ushort *local_1a0;
  size_t *local_198;
  size_t local_190;
  size_t local_188;
  uint local_180;
  uint32_t local_17c;
  ptls_buffer_t local_178;
  ptls_buffer_t *local_150;
  ulong local_148;
  uint32_t local_13c;
  ptls_iovec_t local_138 [16];
  
  aVar20 = tls->state;
  if (PTLS_STATE_SERVER_EXPECT_FINISHED < aVar20) {
    __assert_fail("tls->state < PTLS_STATE_POST_HANDSHAKE_MIN",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/../lib/picotls.c"
                  ,0x8e5,
                  "int ptls_handshake(ptls_t *, ptls_buffer_t *, const void *, size_t *, ptls_handshake_properties_t *)"
                 );
  }
  sVar7 = sendbuf->off;
  if (aVar20 == PTLS_STATE_CLIENT_SEND_EARLY_DATA) {
    iVar15 = send_alert(tls,sendbuf,'\x01','\x01');
    if (iVar15 != 0) {
      return iVar15;
    }
    tls->state = PTLS_STATE_CLIENT_EXPECT_SERVER_HELLO;
LAB_0010b00f:
    pvVar2 = (void *)((long)input + *inlen);
    local_178.base = (uint8_t *)local_138;
    local_178.off = 0;
    local_178.capacity = 0x100;
    local_178._24_8_ = (ulong)(uint)local_178._28_4_ << 0x20;
    local_198 = inlen;
    if (*inlen == 0) {
      uVar13 = 0x202;
    }
    else {
      do {
        local_1a0 = (ushort *)((long)pvVar2 - (long)input);
        uVar13 = handle_input(tls,sendbuf,&local_178,input,(size_t *)&local_1a0,properties);
        if (local_178.off != 0) {
          __assert_fail("decryptbuf.off == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/../lib/picotls.c"
                        ,0x901,
                        "int ptls_handshake(ptls_t *, ptls_buffer_t *, const void *, size_t *, ptls_handshake_properties_t *)"
                       );
        }
        input = (void *)((long)input + (long)local_1a0);
      } while ((uVar13 == 0x202) && (input != pvVar2));
    }
    puVar3 = local_178.base;
    (*ptls_clear_memory)(local_178.base,local_178.off);
    if (local_178.is_allocated != 0) {
      free(puVar3);
    }
    local_178.off = 0;
    local_178.is_allocated = 0;
    local_178._28_4_ = 0;
    local_178.base = (uint8_t *)0x0;
    local_178.capacity = 0;
    if (uVar13 == 0) {
      bVar4 = *(byte *)&(tls->field_7).server;
      uVar13 = 0;
      if ((bVar4 & 1) != 0) {
        *(byte *)&(tls->field_7).server = bVar4 & 0xfe;
        uVar13 = send_session_ticket(tls,sendbuf);
      }
    }
    if ((uVar13 != 0) && (uVar13 != 0x202)) {
      (*ptls_clear_memory)(sendbuf->base + sVar7,sendbuf->off - sVar7);
      sendbuf->off = sVar7;
      if ((uVar13 & 0xffffff00) != 0x100) {
        uVar14 = 0x50;
        if ((uVar13 & 0xffffff00) == 0) {
          uVar14 = uVar13;
        }
        iVar15 = send_alert(tls,sendbuf,'\x02',(uint8_t)uVar14);
        if (iVar15 != 0) {
          sendbuf->off = sVar7;
        }
      }
    }
    *local_198 = (long)input + (*local_198 - (long)pvVar2);
    return uVar13;
  }
  if (aVar20 != PTLS_STATE_CLIENT_HANDSHAKE_START) goto LAB_0010b00f;
  if ((input != (void *)0x0) && (*inlen != 0)) {
    __assert_fail("input == NULL || *inlen == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/../lib/picotls.c"
                  ,0x8ea,
                  "int ptls_handshake(ptls_t *, ptls_buffer_t *, const void *, size_t *, ptls_handshake_properties_t *)"
                 );
  }
  ppVar8 = tls->ctx;
  algo = (*ppVar8->cipher_suites)->hash;
  if (properties == (ptls_handshake_properties_t *)0x0) {
    local_198 = (size_t *)0x0;
    local_1b0 = (ptls_cipher_suite_t *)0x0;
    uVar28 = 0;
    puVar31 = (ushort *)0x0;
  }
  else {
    puVar31 = (ushort *)(properties->client).session_ticket.base;
    if (puVar31 == (ushort *)0x0) {
      local_198 = (size_t *)0x0;
      local_1b0 = (ptls_cipher_suite_t *)0x0;
      puVar31 = (ushort *)0x0;
      uVar28 = 0;
    }
    else {
      end = (ushort *)((properties->client).session_ticket.len + (long)puVar31);
      local_1a0 = puVar31;
      uVar13 = decode64(&local_148,(uint8_t **)&local_1a0,(uint8_t *)end);
      local_150 = sendbuf;
      if (uVar13 == 0) {
        inlen = (size_t *)((long)end - (long)local_1a0);
        if ((long)inlen < 2) {
          uVar13 = 0x32;
        }
        else {
          in_R11W = *local_1a0 << 8 | *local_1a0 >> 8;
          local_1a0 = local_1a0 + 1;
          uVar13 = 0;
        }
        local_198 = (size_t *)0x0;
        local_1b0 = (ptls_cipher_suite_t *)0x0;
        uVar30 = 0;
        puVar21 = (ushort *)0x0;
        if (1 < (long)inlen) {
          inlen = (ulong *)0x32;
          if ((ulong)((long)end - (long)local_1a0) < 3) {
LAB_0010b247:
            bVar33 = false;
            puVar31 = local_1a0;
          }
          else {
            lVar18 = 0;
            uVar28 = 0;
            do {
              uVar28 = (ulong)*(byte *)((long)local_1a0 + lVar18) | uVar28 << 8;
              lVar18 = lVar18 + 1;
            } while (lVar18 != 3);
            local_1a0 = (ushort *)((long)local_1a0 + 3);
            if ((ulong)((long)end - (long)local_1a0) < uVar28) goto LAB_0010b247;
            puVar31 = (ushort *)(uVar28 + (long)local_1a0);
            uVar13 = decode_new_session_ticket
                               (&local_13c,&local_17c,(ptls_iovec_t *)&local_178,&local_180,
                                (uint8_t *)local_1a0,(uint8_t *)puVar31);
            inlen = (ulong *)0x0;
            bVar33 = uVar13 == 0;
            if (!bVar33) {
              inlen = (size_t *)(ulong)uVar13;
              puVar31 = local_1a0;
            }
          }
          local_1a0 = puVar31;
          if (bVar33) {
            uVar13 = 0x32;
            local_198 = (size_t *)0x0;
            if ((ulong)((long)end - (long)local_1a0) < 2) {
LAB_0010b2dc:
              uVar30 = 0;
              puVar21 = (ushort *)0x0;
              bVar33 = false;
            }
            else {
              lVar18 = 0;
              uVar30 = 0;
              do {
                uVar30 = (ulong)*(byte *)((long)local_1a0 + lVar18) | uVar30 << 8;
                lVar18 = lVar18 + 1;
              } while (lVar18 != 2);
              puVar21 = local_1a0 + 1;
              local_1a0 = puVar21;
              if ((ulong)((long)end - (long)puVar21) < uVar30) goto LAB_0010b2dc;
              local_1a0 = (ushort *)((long)puVar21 + uVar30);
              bVar33 = true;
              uVar13 = (uint)inlen;
            }
            if (bVar33) {
              if (local_1a0 == end) {
                pppVar27 = ppVar8->cipher_suites;
                local_1b0 = *pppVar27;
                inlen = (ulong *)0x203;
                if (local_1b0 == (ptls_cipher_suite_t *)0x0) {
                  local_1b0 = (ptls_cipher_suite_t *)0x0;
                  bVar33 = false;
                }
                else {
                  bVar33 = true;
                  uVar5 = local_1b0->id;
                  while (uVar5 != in_R11W) {
                    pppVar27 = pppVar27 + 1;
                    local_1b0 = *pppVar27;
                    bVar33 = local_1b0 != (ptls_cipher_suite_t *)0x0;
                    if (local_1b0 == (ptls_cipher_suite_t *)0x0) {
                      local_1b0 = (ptls_cipher_suite_t *)0x0;
                      goto LAB_0010b66a;
                    }
                    uVar5 = local_1b0->id;
                  }
                  inlen = (size_t *)(ulong)uVar13;
                }
LAB_0010b66a:
                if (!bVar33) goto LAB_0010b2ec;
                gettimeofday((timeval *)local_138,(__timezone_ptr_t)0x0);
                inlen = (size_t *)((long)local_138[0].base * 1000);
                uVar28 = (long)local_138[0].len / 1000 + (long)inlen;
                uVar19 = uVar28 - local_148;
                if (uVar28 < local_148) {
                  uVar13 = 0x32;
                  goto LAB_0010afda;
                }
                if (uVar19 < 0x240c8400) {
                  uVar13 = 0;
                  local_198 = (size_t *)(ulong)((int)uVar19 + local_17c);
                }
                else {
                  uVar13 = 0x32;
                  local_198 = (size_t *)0x0;
                }
              }
              else {
                local_198 = (size_t *)0x0;
                local_1b0 = (ptls_cipher_suite_t *)0x0;
                uVar13 = 0x32;
              }
            }
            else {
              local_1b0 = (ptls_cipher_suite_t *)0x0;
            }
          }
          else {
            local_1b0 = (ptls_cipher_suite_t *)0x0;
            uVar30 = 0;
            puVar21 = (ushort *)0x0;
LAB_0010b2ec:
            local_198 = (size_t *)0x0;
            uVar13 = (uint)inlen;
          }
        }
      }
      else {
        local_1b0 = (ptls_cipher_suite_t *)0x0;
        uVar30 = 0;
        puVar21 = (ushort *)0x0;
LAB_0010afda:
        local_198 = (size_t *)0x0;
      }
      puVar31 = (ushort *)0x0;
      sendbuf = local_150;
      uVar28 = 0;
      if (uVar13 == 0) {
        puVar31 = (ushort *)0x0;
        uVar28 = 0;
        if (local_1b0->hash == algo) {
          puVar1 = &(tls->field_7).client.field_0x20;
          *puVar1 = *puVar1 | 1;
          puVar31 = puVar21;
          uVar28 = uVar30;
          if (((ulong)local_180 != 0) &&
             (inlen = (properties->client).max_early_data_size, inlen != (ulong *)0x0)) {
            *inlen = (ulong)local_180;
            puVar1 = &(tls->field_7).client.field_0x20;
            *puVar1 = *puVar1 | 2;
          }
        }
      }
    }
    if (((properties->client).max_early_data_size != (size_t *)0x0) &&
       (((tls->field_7).client.field_0x20 & 2) == 0)) {
      *(properties->client).max_early_data_size = 0;
    }
  }
  sched = key_schedule_new(algo);
  tls->key_schedule = sched;
  ikm.len = uVar28;
  ikm.base = (uint8_t *)puVar31;
  iVar15 = key_schedule_extract(sched,ikm);
  if (iVar15 != 0) goto LAB_0010b3e2;
  sVar7 = sendbuf->off;
  iVar15 = ptls_buffer_reserve(sendbuf,3);
  if (iVar15 == 0) {
    puVar9 = sendbuf->base;
    inlen = (size_t *)sendbuf->off;
    puVar3 = puVar9 + (long)inlen;
    puVar3[0] = '\x16';
    puVar3[1] = '\x03';
    (puVar9 + 2)[(long)inlen] = '\x01';
    sendbuf->off = sendbuf->off + 3;
    iVar15 = 0;
  }
  if (iVar15 != 0) goto LAB_0010b3e2;
  iVar15 = ptls_buffer_reserve(sendbuf,2);
  if (iVar15 == 0) {
    puVar3 = sendbuf->base;
    inlen = (size_t *)sendbuf->off;
    (puVar3 + (long)inlen)[0] = '\0';
    (puVar3 + (long)inlen)[1] = '\0';
    sendbuf->off = sendbuf->off + 2;
    iVar15 = 0;
  }
  iVar16 = (int)inlen;
  bVar33 = true;
  if (iVar15 == 0) {
    sVar22 = sendbuf->off;
    iVar15 = ptls_buffer_reserve(sendbuf,1);
    if (iVar15 == 0) {
      inlen = (size_t *)sendbuf->off;
      sendbuf->base[(long)inlen] = '\x01';
      sendbuf->off = sendbuf->off + 1;
      iVar15 = 0;
    }
    iVar16 = (int)inlen;
    bVar32 = true;
    bVar33 = bVar32;
    if (iVar15 == 0) {
      iVar15 = ptls_buffer_reserve(sendbuf,3);
      if (iVar15 == 0) {
        puVar3 = sendbuf->base;
        inlen = (size_t *)sendbuf->off;
        (puVar3 + 2)[(long)inlen] = '\0';
        puVar3 = puVar3 + (long)inlen;
        puVar3[0] = '\0';
        puVar3[1] = '\0';
        sendbuf->off = sendbuf->off + 3;
        iVar15 = 0;
      }
      iVar16 = (int)inlen;
      if (iVar15 == 0) {
        sVar25 = sendbuf->off;
        iVar15 = ptls_buffer_reserve(sendbuf,2);
        if (iVar15 == 0) {
          puVar3 = sendbuf->base;
          inlen = (size_t *)sendbuf->off;
          (puVar3 + (long)inlen)[0] = '\x03';
          (puVar3 + (long)inlen)[1] = '\x03';
          sendbuf->off = sendbuf->off + 2;
          iVar15 = 0;
        }
        bVar33 = iVar15 != 0;
        sVar26 = CONCAT71((int7)((ulong)inlen >> 8),bVar33);
        iVar16 = (int)sVar26;
        if (iVar15 == 0) {
          iVar15 = ptls_buffer_reserve(sendbuf,0x20);
          iVar16 = (int)sVar26;
          bVar33 = bVar32;
          if (iVar15 == 0) {
            (*tls->ctx->random_bytes)(sendbuf->base + sendbuf->off,0x20);
            sendbuf->off = sendbuf->off + 0x20;
            iVar15 = ptls_buffer_reserve(sendbuf,1);
            if (iVar15 == 0) {
              sVar26 = sendbuf->off;
              sendbuf->base[sVar26] = '\0';
              sendbuf->off = sendbuf->off + 1;
              iVar15 = 0;
            }
            iVar16 = (int)sVar26;
            bVar33 = true;
            if (iVar15 == 0) {
              ppVar17 = (ptls_t *)sendbuf->off;
              (sendbuf->base + -0x59)[(long)&(ppVar17->traffic_protection).dec] = '\0';
              iVar15 = ptls_buffer_reserve(sendbuf,2);
              if (iVar15 == 0) {
                puVar3 = sendbuf->base;
                ppVar17 = (ptls_t *)sendbuf->off;
                (puVar3 + -0x58 + (long)&(ppVar17->traffic_protection).dec)[0] = '\0';
                (puVar3 + -0x58 + (long)&(ppVar17->traffic_protection).dec)[1] = '\0';
                sendbuf->off = sendbuf->off + 2;
                iVar15 = 0;
              }
              bVar33 = true;
              if (iVar15 == 0) {
                local_190 = sendbuf->off;
                pppVar27 = tls->ctx->cipher_suites;
                ppVar17 = (ptls_t *)*pppVar27;
                bVar33 = false;
                local_188 = sVar25;
                if (ppVar17 == (ptls_t *)0x0) {
                  bVar32 = true;
                  iVar15 = 0;
                }
                else {
                  do {
                    pppVar27 = pppVar27 + 1;
                    uVar6 = *(ushort *)&ppVar17->ctx;
                    iVar15 = ptls_buffer_reserve(sendbuf,2);
                    if (iVar15 == 0) {
                      ppVar17 = (ptls_t *)sendbuf->off;
                      *(ushort *)(sendbuf->base + -0x58 + (long)&(ppVar17->traffic_protection).dec)
                           = uVar6 << 8 | uVar6 >> 8;
                      sendbuf->off = sendbuf->off + 2;
                      iVar15 = 0;
                    }
                    bVar32 = iVar15 == 0;
                    if (!bVar32) {
                      bVar33 = true;
                      break;
                    }
                    ppVar17 = (ptls_t *)*pppVar27;
                  } while (ppVar17 != (ptls_t *)0x0);
                }
                sVar25 = local_188;
                if (bVar32) {
                  sVar26 = sendbuf->off;
                  lVar18 = 8;
                  sVar29 = local_190;
                  do {
                    sendbuf->base[sVar29 - 2] =
                         (uint8_t)(sVar26 - local_190 >> ((byte)lVar18 & 0x3f));
                    lVar18 = lVar18 + -8;
                    sVar29 = sVar29 + 1;
                  } while (lVar18 != -8);
                  bVar33 = false;
                  ppVar17 = (ptls_t *)0xfffffffffffffff8;
                }
              }
              iVar16 = (int)ppVar17;
              if (!bVar33) {
                local_188 = sVar25;
                iVar15 = ptls_buffer_reserve(sendbuf,1);
                if (iVar15 == 0) {
                  ppVar17 = (ptls_t *)sendbuf->off;
                  (sendbuf->base + -0x58)[(long)&(ppVar17->traffic_protection).dec] = '\0';
                  sendbuf->off = sendbuf->off + 1;
                  iVar15 = 0;
                }
                bVar33 = true;
                if (iVar15 == 0) {
                  sVar25 = sendbuf->off;
                  iVar15 = ptls_buffer_reserve(sendbuf,1);
                  if (iVar15 == 0) {
                    ppVar17 = (ptls_t *)sendbuf->off;
                    (sendbuf->base + -0x58)[(long)&(ppVar17->traffic_protection).dec] = '\0';
                    sendbuf->off = sendbuf->off + 1;
                    iVar15 = 0;
                  }
                  bVar32 = false;
                  if (iVar15 == 0) {
                    ppVar17 = (ptls_t *)sendbuf->base;
                    (ppVar17->traffic_protection).dec.secret[sVar25 - 0x59] =
                         (char)(int)sendbuf->off - (char)sVar25;
                    bVar32 = true;
                    bVar33 = false;
                  }
                }
                else {
                  bVar32 = false;
                }
                iVar16 = (int)ppVar17;
                if (bVar32) {
                  iVar15 = ptls_buffer_reserve(sendbuf,2);
                  if (iVar15 == 0) {
                    puVar3 = sendbuf->base;
                    ppVar17 = (ptls_t *)sendbuf->off;
                    (puVar3 + -0x58 + (long)&(ppVar17->traffic_protection).dec)[0] = '\0';
                    (puVar3 + -0x58 + (long)&(ppVar17->traffic_protection).dec)[1] = '\0';
                    sendbuf->off = sendbuf->off + 2;
                    iVar15 = 0;
                  }
                  bVar33 = true;
                  if (iVar15 == 0) {
                    local_190 = sendbuf->off;
                    iVar15 = ptls_buffer_reserve(sendbuf,2);
                    if (iVar15 == 0) {
                      puVar3 = sendbuf->base;
                      ppVar17 = (ptls_t *)sendbuf->off;
                      (puVar3 + -0x58 + (long)&(ppVar17->traffic_protection).dec)[0] = '\0';
                      (puVar3 + -0x58 + (long)&(ppVar17->traffic_protection).dec)[1] = '+';
                      sendbuf->off = sendbuf->off + 2;
                      iVar15 = 0;
                    }
                    bVar33 = iVar15 != 0;
                    if (iVar15 == 0) {
                      iVar15 = ptls_buffer_reserve(sendbuf,2);
                      if (iVar15 == 0) {
                        puVar3 = sendbuf->base;
                        ppVar17 = (ptls_t *)sendbuf->off;
                        (puVar3 + -0x58 + (long)&(ppVar17->traffic_protection).dec)[0] = '\0';
                        (puVar3 + -0x58 + (long)&(ppVar17->traffic_protection).dec)[1] = '\0';
                        sendbuf->off = sendbuf->off + 2;
                        iVar15 = 0;
                      }
                      bVar33 = true;
                      if (iVar15 == 0) {
                        local_1c8 = sendbuf->off;
                        iVar15 = ptls_buffer_reserve(sendbuf,1);
                        if (iVar15 == 0) {
                          ppVar17 = (ptls_t *)sendbuf->off;
                          (sendbuf->base + -0x58)[(long)&(ppVar17->traffic_protection).dec] = '\0';
                          sendbuf->off = sendbuf->off + 1;
                          iVar15 = 0;
                        }
                        bVar33 = true;
                        if (iVar15 == 0) {
                          sVar25 = sendbuf->off;
                          iVar15 = ptls_buffer_reserve(sendbuf,2);
                          if (iVar15 == 0) {
                            puVar3 = sendbuf->base;
                            ppVar17 = (ptls_t *)sendbuf->off;
                            (puVar3 + -0x58 + (long)&(ppVar17->traffic_protection).dec)[0] = '\x7f';
                            (puVar3 + -0x58 + (long)&(ppVar17->traffic_protection).dec)[1] = '\x12';
                            sendbuf->off = sendbuf->off + 2;
                            iVar15 = 0;
                          }
                          bVar33 = iVar15 != 0;
                          if (iVar15 == 0) {
                            ppVar17 = (ptls_t *)sendbuf->base;
                            (ppVar17->traffic_protection).dec.secret[sVar25 - 0x59] =
                                 (char)(int)sendbuf->off - (char)sVar25;
                            bVar33 = false;
                          }
                        }
                        if (!bVar33) {
                          uVar28 = sendbuf->off - local_1c8;
                          lVar18 = 8;
                          do {
                            sendbuf->base[local_1c8 - 2] =
                                 (uint8_t)(uVar28 >> ((byte)lVar18 & 0x3f));
                            lVar18 = lVar18 + -8;
                            local_1c8 = local_1c8 + 1;
                          } while (lVar18 != -8);
                          bVar33 = false;
                          ppVar17 = (ptls_t *)0xfffffffffffffff8;
                        }
                      }
                      if (!bVar33) {
                        iVar15 = ptls_buffer_reserve(sendbuf,2);
                        if (iVar15 == 0) {
                          puVar3 = sendbuf->base;
                          ppVar17 = (ptls_t *)sendbuf->off;
                          (puVar3 + -0x58 + (long)&(ppVar17->traffic_protection).dec)[0] = '\0';
                          (puVar3 + -0x58 + (long)&(ppVar17->traffic_protection).dec)[1] = '\r';
                          sendbuf->off = sendbuf->off + 2;
                          iVar15 = 0;
                        }
                        bVar33 = iVar15 != 0;
                        if (!bVar33) {
                          iVar15 = ptls_buffer_reserve(sendbuf,2);
                          if (iVar15 == 0) {
                            puVar3 = sendbuf->base;
                            ppVar17 = (ptls_t *)sendbuf->off;
                            (puVar3 + -0x58 + (long)&(ppVar17->traffic_protection).dec)[0] = '\0';
                            (puVar3 + -0x58 + (long)&(ppVar17->traffic_protection).dec)[1] = '\0';
                            sendbuf->off = sendbuf->off + 2;
                            iVar15 = 0;
                          }
                          bVar33 = true;
                          if (iVar15 == 0) {
                            local_1c8 = sendbuf->off;
                            iVar15 = ptls_buffer_reserve(sendbuf,2);
                            if (iVar15 == 0) {
                              puVar3 = sendbuf->base;
                              ppVar17 = (ptls_t *)sendbuf->off;
                              (puVar3 + -0x58 + (long)&(ppVar17->traffic_protection).dec)[0] = '\0';
                              (puVar3 + -0x58 + (long)&(ppVar17->traffic_protection).dec)[1] = '\0';
                              sendbuf->off = sendbuf->off + 2;
                              iVar15 = 0;
                            }
                            bVar33 = true;
                            if (iVar15 == 0) {
                              local_1b8 = sendbuf->off;
                              iVar15 = ptls_buffer_reserve(sendbuf,2);
                              if (iVar15 == 0) {
                                puVar3 = sendbuf->base;
                                ppVar17 = (ptls_t *)sendbuf->off;
                                (puVar3 + -0x58 + (long)&(ppVar17->traffic_protection).dec)[0] =
                                     '\b';
                                (puVar3 + -0x58 + (long)&(ppVar17->traffic_protection).dec)[1] =
                                     '\x04';
                                sendbuf->off = sendbuf->off + 2;
                                iVar15 = 0;
                              }
                              bVar33 = iVar15 != 0;
                              if (!bVar33) {
                                iVar15 = ptls_buffer_reserve(sendbuf,2);
                                if (iVar15 == 0) {
                                  puVar3 = sendbuf->base;
                                  ppVar17 = (ptls_t *)sendbuf->off;
                                  (puVar3 + -0x58 + (long)&(ppVar17->traffic_protection).dec)[0] =
                                       '\x04';
                                  (puVar3 + -0x58 + (long)&(ppVar17->traffic_protection).dec)[1] =
                                       '\x03';
                                  sendbuf->off = sendbuf->off + 2;
                                  iVar15 = 0;
                                }
                                bVar33 = iVar15 != 0;
                                if (!bVar33) {
                                  iVar15 = ptls_buffer_reserve(sendbuf,2);
                                  if (iVar15 == 0) {
                                    puVar3 = sendbuf->base;
                                    ppVar17 = (ptls_t *)sendbuf->off;
                                    (puVar3 + -0x58 + (long)&(ppVar17->traffic_protection).dec)[0] =
                                         '\x04';
                                    (puVar3 + -0x58 + (long)&(ppVar17->traffic_protection).dec)[1] =
                                         '\x01';
                                    sendbuf->off = sendbuf->off + 2;
                                    iVar15 = 0;
                                  }
                                  bVar33 = iVar15 != 0;
                                  if (!bVar33) {
                                    iVar15 = ptls_buffer_reserve(sendbuf,2);
                                    if (iVar15 == 0) {
                                      puVar3 = sendbuf->base;
                                      ppVar17 = (ptls_t *)sendbuf->off;
                                      (puVar3 + -0x58 + (long)&(ppVar17->traffic_protection).dec)[0]
                                           = '\x02';
                                      (puVar3 + -0x58 + (long)&(ppVar17->traffic_protection).dec)[1]
                                           = '\x01';
                                      sendbuf->off = sendbuf->off + 2;
                                      iVar15 = 0;
                                    }
                                    bVar33 = iVar15 != 0;
                                    if (iVar15 == 0) {
                                      uVar28 = sendbuf->off - local_1b8;
                                      lVar18 = 8;
                                      bVar33 = false;
                                      do {
                                        sendbuf->base[local_1b8 - 2] =
                                             (uint8_t)(uVar28 >> ((byte)lVar18 & 0x3f));
                                        lVar18 = lVar18 + -8;
                                        local_1b8 = local_1b8 + 1;
                                      } while (lVar18 != -8);
                                      ppVar17 = (ptls_t *)0xfffffffffffffff8;
                                    }
                                  }
                                }
                              }
                            }
                            if (!bVar33) {
                              uVar28 = sendbuf->off - local_1c8;
                              lVar18 = 8;
                              do {
                                sendbuf->base[local_1c8 - 2] =
                                     (uint8_t)(uVar28 >> ((byte)lVar18 & 0x3f));
                                lVar18 = lVar18 + -8;
                                local_1c8 = local_1c8 + 1;
                              } while (lVar18 != -8);
                              bVar33 = false;
                              ppVar17 = (ptls_t *)0xfffffffffffffff8;
                            }
                          }
                          if (!bVar33) {
                            iVar15 = ptls_buffer_reserve(sendbuf,2);
                            if (iVar15 == 0) {
                              puVar3 = sendbuf->base;
                              ppVar17 = (ptls_t *)sendbuf->off;
                              (puVar3 + -0x58 + (long)&(ppVar17->traffic_protection).dec)[0] = '\0';
                              (puVar3 + -0x58 + (long)&(ppVar17->traffic_protection).dec)[1] = '\n';
                              sendbuf->off = sendbuf->off + 2;
                              iVar15 = 0;
                            }
                            bVar33 = iVar15 != 0;
                            if (!bVar33) {
                              iVar15 = ptls_buffer_reserve(sendbuf,2);
                              if (iVar15 == 0) {
                                puVar3 = sendbuf->base;
                                ppVar17 = (ptls_t *)sendbuf->off;
                                (puVar3 + -0x58 + (long)&(ppVar17->traffic_protection).dec)[0] =
                                     '\0';
                                (puVar3 + -0x58 + (long)&(ppVar17->traffic_protection).dec)[1] =
                                     '\0';
                                sendbuf->off = sendbuf->off + 2;
                                iVar15 = 0;
                              }
                              bVar33 = true;
                              if (iVar15 == 0) {
                                local_1c8 = sendbuf->off;
                                local_1a8 = tls->ctx->key_exchanges;
                                iVar15 = ptls_buffer_reserve(sendbuf,2);
                                if (iVar15 == 0) {
                                  puVar3 = sendbuf->base;
                                  sVar25 = sendbuf->off;
                                  (puVar3 + sVar25)[0] = '\0';
                                  (puVar3 + sVar25)[1] = '\0';
                                  sendbuf->off = sendbuf->off + 2;
                                  iVar15 = 0;
                                }
                                bVar33 = true;
                                if (iVar15 == 0) {
                                  local_1b8 = sendbuf->off;
                                  ppVar11 = *local_1a8;
                                  iVar15 = 0;
                                  while (ppVar11 != (ptls_key_exchange_algorithm_t *)0x0) {
                                    local_1a8 = local_1a8 + 1;
                                    uVar6 = ppVar11->id;
                                    iVar15 = ptls_buffer_reserve(sendbuf,2);
                                    if (iVar15 == 0) {
                                      *(ushort *)(sendbuf->base + sendbuf->off) =
                                           uVar6 << 8 | uVar6 >> 8;
                                      sendbuf->off = sendbuf->off + 2;
                                      iVar15 = 0;
                                    }
                                    if (iVar15 != 0) {
                                      ppVar17 = (ptls_t *)0x0;
                                      goto LAB_0010be63;
                                    }
                                    ppVar11 = *local_1a8;
                                  }
                                  uVar28 = sendbuf->off - local_1b8;
                                  lVar18 = 8;
                                  do {
                                    sendbuf->base[local_1b8 - 2] =
                                         (uint8_t)(uVar28 >> ((byte)lVar18 & 0x3f));
                                    lVar18 = lVar18 + -8;
                                    local_1b8 = local_1b8 + 1;
                                  } while (lVar18 != -8);
                                  bVar33 = false;
                                  ppVar17 = (ptls_t *)0xffffffffffffff01;
                                }
                                else {
                                  ppVar17 = (ptls_t *)0x0;
                                }
LAB_0010be63:
                                if ((char)ppVar17 != '\0') {
                                  uVar28 = sendbuf->off - local_1c8;
                                  lVar18 = 8;
                                  do {
                                    sendbuf->base[local_1c8 - 2] =
                                         (uint8_t)(uVar28 >> ((byte)lVar18 & 0x3f));
                                    lVar18 = lVar18 + -8;
                                    local_1c8 = local_1c8 + 1;
                                  } while (lVar18 != -8);
                                  bVar33 = false;
                                  ppVar17 = (ptls_t *)0xfffffffffffffff8;
                                }
                              }
                              if (!bVar33) {
                                iVar15 = ptls_buffer_reserve(sendbuf,2);
                                if (iVar15 == 0) {
                                  puVar3 = sendbuf->base;
                                  ppVar17 = (ptls_t *)sendbuf->off;
                                  (puVar3 + -0x58 + (long)&(ppVar17->traffic_protection).dec)[0] =
                                       '\0';
                                  (puVar3 + -0x58 + (long)&(ppVar17->traffic_protection).dec)[1] =
                                       '(';
                                  sendbuf->off = sendbuf->off + 2;
                                  iVar15 = 0;
                                }
                                bVar33 = iVar15 != 0;
                                if (!bVar33) {
                                  iVar15 = ptls_buffer_reserve(sendbuf,2);
                                  if (iVar15 == 0) {
                                    puVar3 = sendbuf->base;
                                    ppVar17 = (ptls_t *)sendbuf->off;
                                    (puVar3 + -0x58 + (long)&(ppVar17->traffic_protection).dec)[0] =
                                         '\0';
                                    (puVar3 + -0x58 + (long)&(ppVar17->traffic_protection).dec)[1] =
                                         '\0';
                                    sendbuf->off = sendbuf->off + 2;
                                    iVar15 = 0;
                                  }
                                  bVar33 = true;
                                  if (iVar15 == 0) {
                                    pppVar12 = tls->ctx->key_exchanges;
                                    if (*pppVar12 == (ptls_key_exchange_algorithm_t *)0x0) {
                                      __assert_fail("*algo != NULL",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/../lib/picotls.c"
                                                  ,0x398,
                                                  "int send_client_hello(ptls_t *, ptls_buffer_t *, ptls_handshake_properties_t *)"
                                                  );
                                    }
                                    local_1c8 = sendbuf->off;
                                    ppVar17 = tls;
                                    iVar15 = (*(*pppVar12)->create)
                                                       (&(tls->field_7).client.key_exchange.ctx,
                                                        local_138);
                                    bVar33 = true;
                                    if (iVar15 == 0) {
                                      (tls->field_7).client.key_exchange.algo = *pppVar12;
                                      ppVar17 = tls;
                                      iVar15 = ptls_buffer_reserve(sendbuf,2);
                                      if (iVar15 == 0) {
                                        puVar3 = sendbuf->base;
                                        ppVar17 = (ptls_t *)sendbuf->off;
                                        (puVar3 + -0x58 + (long)&(ppVar17->traffic_protection).dec)
                                        [0] = '\0';
                                        (puVar3 + -0x58 + (long)&(ppVar17->traffic_protection).dec)
                                        [1] = '\0';
                                        sendbuf->off = sendbuf->off + 2;
                                        iVar15 = 0;
                                      }
                                      if (iVar15 == 0) {
                                        local_1b8 = sendbuf->off;
                                        uVar6 = ((tls->field_7).client.key_exchange.algo)->id;
                                        iVar15 = ptls_buffer_reserve(sendbuf,2);
                                        if (iVar15 == 0) {
                                          ppVar17 = (ptls_t *)sendbuf->off;
                                          *(ushort *)
                                           (sendbuf->base + -0x58 +
                                           (long)&(ppVar17->traffic_protection).dec) =
                                               uVar6 << 8 | uVar6 >> 8;
                                          sendbuf->off = sendbuf->off + 2;
                                          iVar15 = 0;
                                        }
                                        bVar33 = iVar15 != 0;
                                        if (iVar15 == 0) {
                                          iVar15 = ptls_buffer_reserve(sendbuf,2);
                                          if (iVar15 == 0) {
                                            puVar3 = sendbuf->base;
                                            ppVar17 = (ptls_t *)sendbuf->off;
                                            (puVar3 + -0x58 +
                                            (long)&(ppVar17->traffic_protection).dec)[0] = '\0';
                                            (puVar3 + -0x58 +
                                            (long)&(ppVar17->traffic_protection).dec)[1] = '\0';
                                            sendbuf->off = sendbuf->off + 2;
                                            iVar15 = 0;
                                          }
                                          bVar33 = true;
                                          if (iVar15 == 0) {
                                            local_1a8 = (ptls_key_exchange_algorithm_t **)
                                                        sendbuf->off;
                                            iVar15 = ptls_buffer__do_pushv
                                                               (sendbuf,local_138[0].base,
                                                                local_138[0].len);
                                            if (iVar15 != 0) goto LAB_0010c09d;
                                            uVar28 = sendbuf->off - (long)local_1a8;
                                            lVar18 = 8;
                                            do {
                                              sendbuf->base[(long)local_1a8 - 2] =
                                                   (uint8_t)(uVar28 >> ((byte)lVar18 & 0x3f));
                                              lVar18 = lVar18 + -8;
                                              local_1a8 = (ptls_key_exchange_algorithm_t **)
                                                          ((long)local_1a8 + 1);
                                            } while (lVar18 != -8);
                                            bVar33 = false;
                                            bVar32 = true;
                                            ppVar17 = (ptls_t *)0xfffffffffffffff8;
                                          }
                                          else {
LAB_0010c09d:
                                            bVar32 = false;
                                          }
                                          if (bVar32) {
                                            uVar28 = sendbuf->off - local_1b8;
                                            ppVar17 = (ptls_t *)0x8;
                                            bVar33 = false;
                                            do {
                                              sendbuf->base[local_1b8 - 2] =
                                                   (uint8_t)(uVar28 >> ((byte)ppVar17 & 0x3f));
                                              ppVar17 = (ptls_t *)((long)ppVar17 + -8);
                                              local_1b8 = local_1b8 + 1;
                                            } while (ppVar17 != (ptls_t *)0xfffffffffffffff8);
                                          }
                                        }
                                      }
                                    }
                                    if (!bVar33) {
                                      uVar28 = sendbuf->off - local_1c8;
                                      lVar18 = 8;
                                      do {
                                        sendbuf->base[local_1c8 - 2] =
                                             (uint8_t)(uVar28 >> ((byte)lVar18 & 0x3f));
                                        lVar18 = lVar18 + -8;
                                        local_1c8 = local_1c8 + 1;
                                      } while (lVar18 != -8);
                                      bVar33 = false;
                                      ppVar17 = (ptls_t *)0xfffffffffffffff8;
                                    }
                                  }
                                  if (!bVar33) {
                                    if (puVar31 == (ushort *)0x0) {
LAB_0010c65f:
                                      uVar28 = sendbuf->off - local_190;
                                      lVar18 = 8;
                                      bVar33 = false;
                                      do {
                                        sendbuf->base[local_190 - 2] =
                                             (uint8_t)(uVar28 >> ((byte)lVar18 & 0x3f));
                                        lVar18 = lVar18 + -8;
                                        local_190 = local_190 + 1;
                                      } while (lVar18 != -8);
                                      ppVar17 = (ptls_t *)0xfffffffffffffff8;
                                    }
                                    else if (((tls->field_7).client.field_0x20 & 2) == 0) {
LAB_0010c135:
                                      iVar15 = ptls_buffer_reserve(sendbuf,2);
                                      if (iVar15 == 0) {
                                        puVar3 = sendbuf->base;
                                        ppVar17 = (ptls_t *)sendbuf->off;
                                        (puVar3 + -0x58 + (long)&(ppVar17->traffic_protection).dec)
                                        [0] = '\0';
                                        (puVar3 + -0x58 + (long)&(ppVar17->traffic_protection).dec)
                                        [1] = '-';
                                        sendbuf->off = sendbuf->off + 2;
                                        iVar15 = 0;
                                      }
                                      bVar33 = iVar15 != 0;
                                      if (!bVar33) {
                                        iVar15 = ptls_buffer_reserve(sendbuf,2);
                                        if (iVar15 == 0) {
                                          puVar3 = sendbuf->base;
                                          ppVar17 = (ptls_t *)sendbuf->off;
                                          (puVar3 + -0x58 + (long)&(ppVar17->traffic_protection).dec
                                          )[0] = '\0';
                                          (puVar3 + -0x58 + (long)&(ppVar17->traffic_protection).dec
                                          )[1] = '\0';
                                          sendbuf->off = sendbuf->off + 2;
                                          iVar15 = 0;
                                        }
                                        bVar33 = true;
                                        if (iVar15 == 0) {
                                          local_1c8 = sendbuf->off;
                                          if (tls->ctx->require_dhe_on_psk == 0) {
                                            iVar15 = ptls_buffer_reserve(sendbuf,1);
                                            if (iVar15 == 0) {
                                              ppVar17 = (ptls_t *)sendbuf->off;
                                              (sendbuf->base + -0x58)
                                              [(long)&(ppVar17->traffic_protection).dec] = '\0';
                                              sendbuf->off = sendbuf->off + 1;
                                              iVar15 = 0;
                                            }
                                            if (iVar15 != 0) goto LAB_0010c2f8;
                                          }
                                          iVar15 = ptls_buffer_reserve(sendbuf,1);
                                          if (iVar15 == 0) {
                                            ppVar17 = (ptls_t *)sendbuf->off;
                                            (sendbuf->base + -0x58)
                                            [(long)&(ppVar17->traffic_protection).dec] = '\x01';
                                            sendbuf->off = sendbuf->off + 1;
                                            iVar15 = 0;
                                          }
                                          if (iVar15 != 0) goto LAB_0010c2f8;
                                          uVar28 = sendbuf->off - local_1c8;
                                          lVar18 = 8;
                                          do {
                                            sendbuf->base[local_1c8 - 2] =
                                                 (uint8_t)(uVar28 >> ((byte)lVar18 & 0x3f));
                                            lVar18 = lVar18 + -8;
                                            local_1c8 = local_1c8 + 1;
                                          } while (lVar18 != -8);
                                          bVar33 = false;
                                          bVar32 = true;
                                          iVar15 = 0;
                                          ppVar17 = (ptls_t *)0xfffffffffffffff8;
                                        }
                                        else {
LAB_0010c2f8:
                                          bVar32 = false;
                                        }
                                        if (bVar32) {
                                          iVar15 = ptls_buffer_reserve(sendbuf,2);
                                          if (iVar15 == 0) {
                                            puVar3 = sendbuf->base;
                                            ppVar17 = (ptls_t *)sendbuf->off;
                                            (puVar3 + -0x58 +
                                            (long)&(ppVar17->traffic_protection).dec)[0] = '\0';
                                            (puVar3 + -0x58 +
                                            (long)&(ppVar17->traffic_protection).dec)[1] = ')';
                                            sendbuf->off = sendbuf->off + 2;
                                            iVar15 = 0;
                                          }
                                          bVar33 = iVar15 != 0;
                                          if (!bVar33) {
                                            iVar15 = ptls_buffer_reserve(sendbuf,2);
                                            if (iVar15 == 0) {
                                              puVar3 = sendbuf->base;
                                              ppVar17 = (ptls_t *)sendbuf->off;
                                              (puVar3 + -0x58 +
                                              (long)&(ppVar17->traffic_protection).dec)[0] = '\0';
                                              (puVar3 + -0x58 +
                                              (long)&(ppVar17->traffic_protection).dec)[1] = '\0';
                                              sendbuf->off = sendbuf->off + 2;
                                              iVar15 = 0;
                                            }
                                            bVar33 = true;
                                            if (iVar15 == 0) {
                                              local_1c8 = sendbuf->off;
                                              iVar15 = ptls_buffer_reserve(sendbuf,2);
                                              if (iVar15 == 0) {
                                                puVar3 = sendbuf->base;
                                                ppVar17 = (ptls_t *)sendbuf->off;
                                                (puVar3 + -0x58 +
                                                (long)&(ppVar17->traffic_protection).dec)[0] = '\0';
                                                (puVar3 + -0x58 +
                                                (long)&(ppVar17->traffic_protection).dec)[1] = '\0';
                                                sendbuf->off = sendbuf->off + 2;
                                                iVar15 = 0;
                                              }
                                              bVar33 = true;
                                              if (iVar15 == 0) {
                                                local_1b8 = sendbuf->off;
                                                iVar15 = ptls_buffer_reserve(sendbuf,2);
                                                if (iVar15 == 0) {
                                                  puVar3 = sendbuf->base;
                                                  ppVar17 = (ptls_t *)sendbuf->off;
                                                  (puVar3 + -0x58 +
                                                  (long)&(ppVar17->traffic_protection).dec)[0] =
                                                       '\0';
                                                  (puVar3 + -0x58 +
                                                  (long)&(ppVar17->traffic_protection).dec)[1] =
                                                       '\0';
                                                  sendbuf->off = sendbuf->off + 2;
                                                  iVar15 = 0;
                                                }
                                                bVar33 = true;
                                                if (iVar15 == 0) {
                                                  local_1a8 = (ptls_key_exchange_algorithm_t **)
                                                              sendbuf->off;
                                                  iVar15 = ptls_buffer__do_pushv
                                                                     (sendbuf,local_178.base,
                                                                      local_178.capacity);
                                                  if (iVar15 != 0) goto LAB_0010c419;
                                                  uVar28 = sendbuf->off - (long)local_1a8;
                                                  lVar18 = 8;
                                                  do {
                                                    sendbuf->base[(long)local_1a8 - 2] =
                                                         (uint8_t)(uVar28 >> ((byte)lVar18 & 0x3f));
                                                    lVar18 = lVar18 + -8;
                                                    local_1a8 = (ptls_key_exchange_algorithm_t **)
                                                                ((long)local_1a8 + 1);
                                                  } while (lVar18 != -8);
                                                  bVar33 = false;
                                                  bVar32 = true;
                                                  ppVar17 = (ptls_t *)0xfffffffffffffff8;
                                                }
                                                else {
LAB_0010c419:
                                                  bVar32 = false;
                                                }
                                                if (bVar32) {
                                                  iVar15 = ptls_buffer_reserve(sendbuf,4);
                                                  if (iVar15 == 0) {
                                                    ppVar17 = (ptls_t *)sendbuf->off;
                                                    uVar13 = (uint)local_198;
                                                    *(uint *)(sendbuf->base + -0x58 +
                                                             (long)&(ppVar17->traffic_protection).
                                                                    dec) =
                                                         uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 |
                                                         (uVar13 & 0xff00) << 8 | uVar13 << 0x18;
                                                    sendbuf->off = sendbuf->off + 4;
                                                    iVar15 = 0;
                                                  }
                                                  bVar33 = iVar15 != 0;
                                                  if (iVar15 == 0) {
                                                    uVar28 = sendbuf->off - local_1b8;
                                                    lVar18 = 8;
                                                    do {
                                                      sendbuf->base[local_1b8 - 2] =
                                                           (uint8_t)(uVar28 >> ((byte)lVar18 & 0x3f)
                                                                    );
                                                      lVar18 = lVar18 + -8;
                                                      local_1b8 = local_1b8 + 1;
                                                    } while (lVar18 != -8);
                                                    bVar33 = false;
                                                    ppVar17 = (ptls_t *)0xfffffffffffffff8;
                                                  }
                                                }
                                              }
                                              if (!bVar33) {
                                                iVar15 = ptls_buffer_reserve(sendbuf,2);
                                                if (iVar15 == 0) {
                                                  puVar3 = sendbuf->base;
                                                  ppVar17 = (ptls_t *)sendbuf->off;
                                                  (puVar3 + -0x58 +
                                                  (long)&(ppVar17->traffic_protection).dec)[0] =
                                                       '\0';
                                                  (puVar3 + -0x58 +
                                                  (long)&(ppVar17->traffic_protection).dec)[1] =
                                                       '\0';
                                                  sendbuf->off = sendbuf->off + 2;
                                                  iVar15 = 0;
                                                }
                                                bVar33 = true;
                                                if (iVar15 == 0) {
                                                  local_198 = (size_t *)sendbuf->off;
                                                  iVar15 = ptls_buffer_reserve(sendbuf,1);
                                                  if (iVar15 == 0) {
                                                    sendbuf->base[sendbuf->off] = '\0';
                                                    sendbuf->off = sendbuf->off + 1;
                                                    iVar15 = 0;
                                                  }
                                                  bVar33 = true;
                                                  if (iVar15 == 0) {
                                                    sVar25 = sendbuf->off;
                                                    iVar15 = ptls_buffer_reserve(sendbuf,tls->
                                                  key_schedule->algo->digest_size);
                                                  ppVar17 = (ptls_t *)0x0;
                                                  if (iVar15 == 0) {
                                                    puVar3 = sendbuf->base;
                                                    sVar26 = sendbuf->off +
                                                             tls->key_schedule->algo->digest_size;
                                                    sendbuf->off = sVar26;
                                                    puVar3[sVar25 - 1] = (char)sVar26 - (char)sVar25
                                                    ;
                                                    ppVar17 = (ptls_t *)
                                                              CONCAT71((int7)((ulong)puVar3 >> 8),1)
                                                    ;
                                                    bVar33 = false;
                                                  }
                                                  }
                                                  else {
                                                    ppVar17 = (ptls_t *)0x0;
                                                  }
                                                  if ((char)ppVar17 != '\0') {
                                                    uVar28 = sendbuf->off - (long)local_198;
                                                    lVar18 = 8;
                                                    do {
                                                      sendbuf->base[(long)local_198 - 2] =
                                                           (uint8_t)(uVar28 >> ((byte)lVar18 & 0x3f)
                                                                    );
                                                      lVar18 = lVar18 + -8;
                                                      local_198 = (size_t *)((long)local_198 + 1);
                                                    } while (lVar18 != -8);
                                                    bVar33 = false;
                                                    ppVar17 = (ptls_t *)0xfffffffffffffff8;
                                                  }
                                                }
                                                if (!bVar33) {
                                                  uVar28 = sendbuf->off - local_1c8;
                                                  lVar18 = 8;
                                                  do {
                                                    sendbuf->base[local_1c8 - 2] =
                                                         (uint8_t)(uVar28 >> ((byte)lVar18 & 0x3f));
                                                    lVar18 = lVar18 + -8;
                                                    local_1c8 = local_1c8 + 1;
                                                  } while (lVar18 != -8);
                                                  bVar33 = false;
                                                  ppVar17 = (ptls_t *)0xfffffffffffffff8;
                                                }
                                              }
                                            }
                                            if (!bVar33) goto LAB_0010c65f;
                                          }
                                        }
                                      }
                                    }
                                    else {
                                      iVar15 = ptls_buffer_reserve(sendbuf,2);
                                      if (iVar15 == 0) {
                                        puVar3 = sendbuf->base;
                                        ppVar17 = (ptls_t *)sendbuf->off;
                                        (puVar3 + -0x58 + (long)&(ppVar17->traffic_protection).dec)
                                        [0] = '\0';
                                        (puVar3 + -0x58 + (long)&(ppVar17->traffic_protection).dec)
                                        [1] = '*';
                                        sendbuf->off = sendbuf->off + 2;
                                        iVar15 = 0;
                                      }
                                      bVar33 = iVar15 != 0;
                                      if (!bVar33) {
                                        iVar15 = ptls_buffer_reserve(sendbuf,2);
                                        if (iVar15 == 0) {
                                          puVar3 = sendbuf->base;
                                          ppVar17 = (ptls_t *)sendbuf->off;
                                          (puVar3 + -0x58 + (long)&(ppVar17->traffic_protection).dec
                                          )[0] = '\0';
                                          (puVar3 + -0x58 + (long)&(ppVar17->traffic_protection).dec
                                          )[1] = '\0';
                                          sendbuf->off = sendbuf->off + 2;
                                          iVar15 = 0;
                                        }
                                        bVar33 = true;
                                        if (iVar15 == 0) {
                                          sVar25 = sendbuf->off;
                                          lVar18 = -2;
                                          do {
                                            sendbuf->base[lVar18 + sVar25] = '\0';
                                            lVar18 = lVar18 + 1;
                                          } while (lVar18 != 0);
                                          bVar33 = false;
                                          ppVar17 = (ptls_t *)0x0;
                                        }
                                        if (iVar15 == 0) goto LAB_0010c135;
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                  if (!bVar33) {
                    sVar25 = sendbuf->off;
                    ppVar17 = (ptls_t *)0x10;
                    bVar33 = false;
                    sVar26 = local_188;
                    do {
                      sendbuf->base[sVar26 - 3] =
                           (uint8_t)(sVar25 - local_188 >> ((byte)ppVar17 & 0x3f));
                      ppVar17 = (ptls_t *)((long)ppVar17 + -8);
                      sVar26 = sVar26 + 1;
                    } while (ppVar17 != (ptls_t *)0xfffffffffffffff8);
                  }
                  iVar16 = (int)ppVar17;
                }
              }
            }
          }
        }
      }
    }
    if (!bVar33) {
      uVar28 = sendbuf->off - sVar22;
      lVar18 = 8;
      do {
        sendbuf->base[sVar22 - 2] = (uint8_t)(uVar28 >> ((byte)lVar18 & 0x3f));
        lVar18 = lVar18 + -8;
        sVar22 = sVar22 + 1;
      } while (lVar18 != -8);
      bVar33 = false;
      iVar16 = -8;
    }
  }
  if (!bVar33) {
    if (bVar33) {
      return iVar16;
    }
    lVar18 = sVar7 + 5;
    if (puVar31 != (ushort *)0x0) {
      lVar23 = sendbuf->off - tls->key_schedule->algo->digest_size;
      psVar10 = tls->key_schedule->msghash;
      lVar24 = lVar23 + -3;
      (*psVar10->update)(psVar10,sendbuf->base + lVar18,lVar24 - lVar18);
      iVar15 = derive_secret(tls->key_schedule,local_138,"resumption psk binder key");
      if (iVar15 == 0) {
        iVar15 = calc_verify_data(sendbuf->base + lVar23,tls->key_schedule,local_138);
        bVar33 = iVar15 == 0;
      }
      else {
        bVar33 = false;
      }
      lVar18 = lVar24;
      if (!bVar33) goto LAB_0010b3e2;
    }
    psVar10 = tls->key_schedule->msghash;
    (*psVar10->update)(psVar10,sendbuf->base + lVar18,sendbuf->off - lVar18);
    aVar20 = PTLS_STATE_CLIENT_EXPECT_SERVER_HELLO;
    if (((tls->field_7).client.field_0x20 & 2) != 0) {
      aVar20 = PTLS_STATE_CLIENT_SEND_EARLY_DATA;
      iVar15 = setup_traffic_protection(tls,local_1b0,1,"client early traffic secret");
      if (iVar15 != 0) goto LAB_0010b3e2;
    }
    tls->state = aVar20;
    iVar15 = 0x202;
  }
LAB_0010b3e2:
  (*ptls_clear_memory)(local_138,0x40);
  return iVar15;
}

Assistant:

int ptls_handshake(ptls_t *tls, ptls_buffer_t *sendbuf, const void *input, size_t *inlen, ptls_handshake_properties_t *properties)
{
    size_t sendbuf_orig_off = sendbuf->off;
    int ret;

    assert(tls->state < PTLS_STATE_POST_HANDSHAKE_MIN);

    /* special handlings */
    switch (tls->state) {
    case PTLS_STATE_CLIENT_HANDSHAKE_START:
        assert(input == NULL || *inlen == 0);
        return send_client_hello(tls, sendbuf, properties);
    case PTLS_STATE_CLIENT_SEND_EARLY_DATA:
        if ((ret = send_alert(tls, sendbuf, PTLS_ALERT_LEVEL_WARNING, PTLS_ALERT_END_OF_EARLY_DATA)) != 0)
            return ret;
        tls->state = PTLS_STATE_CLIENT_EXPECT_SERVER_HELLO;
        break;
    default:
        break;
    }

    const uint8_t *src = input, *src_end = src + *inlen;
    ptls_buffer_t decryptbuf;
    uint8_t decryptbuf_small[256];

    ptls_buffer_init(&decryptbuf, decryptbuf_small, sizeof(decryptbuf_small));

    /* perform handhake until completion or until all the input has been swallowed */
    ret = PTLS_ERROR_HANDSHAKE_IN_PROGRESS;
    while (ret == PTLS_ERROR_HANDSHAKE_IN_PROGRESS && src != src_end) {
        size_t consumed = src_end - src;
        ret = handle_input(tls, sendbuf, &decryptbuf, src, &consumed, properties);
        src += consumed;
        assert(decryptbuf.off == 0);
    }

    ptls_buffer_dispose(&decryptbuf);

    if (ret == 0 && tls->server.send_ticket) {
        tls->server.send_ticket = 0;
        ret = send_session_ticket(tls, sendbuf);
    }

    if (!(ret == 0 || ret == PTLS_ERROR_HANDSHAKE_IN_PROGRESS)) {
        /* flush partially written response */
        ptls_clear_memory(sendbuf->base + sendbuf_orig_off, sendbuf->off - sendbuf_orig_off);
        sendbuf->off = sendbuf_orig_off;
        /* send alert immediately */
        if (PTLS_ERROR_GET_CLASS(ret) != PTLS_ERROR_CLASS_PEER_ALERT)
            if (send_alert(tls, sendbuf, PTLS_ALERT_LEVEL_FATAL,
                           PTLS_ERROR_GET_CLASS(ret) == PTLS_ERROR_CLASS_SELF_ALERT ? ret : PTLS_ALERT_INTERNAL_ERROR) != 0)
                sendbuf->off = sendbuf_orig_off;
    }

    *inlen -= src_end - src;
    return ret;
}